

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

void gl4cts::SparseTextureUtils::getTextureLevelSize
               (GLint target,TextureState *state,GLint level,GLint *width,GLint *height,GLint *depth
               )

{
  int iVar1;
  double dVar2;
  GLint *depth_local;
  GLint *height_local;
  GLint *width_local;
  GLint level_local;
  TextureState *state_local;
  GLint target_local;
  
  iVar1 = state->width;
  dVar2 = pow(2.0,(double)level);
  *width = iVar1 / (int)dVar2;
  if ((target == 0xde0) || (target == 0x8c18)) {
    *height = 1;
  }
  else {
    iVar1 = state->height;
    dVar2 = pow(2.0,(double)level);
    *height = iVar1 / (int)dVar2;
  }
  if (target == 0x806f) {
    iVar1 = state->depth;
    dVar2 = pow(2.0,(double)level);
    *depth = iVar1 / (int)dVar2;
  }
  else if (((target == 0x8c18) || (target == 0x8c1a)) || (target == 0x9009)) {
    *depth = state->depth;
  }
  else {
    *depth = 1;
  }
  return;
}

Assistant:

void SparseTextureUtils::getTextureLevelSize(GLint target, TextureState& state, GLint level, GLint& width,
											 GLint& height, GLint& depth)
{
	width = state.width / (int)pow(2, level);
	if (target == GL_TEXTURE_1D || target == GL_TEXTURE_1D_ARRAY)
		height = 1;
	else
		height = state.height / (int)pow(2, level);

	if (target == GL_TEXTURE_3D)
		depth = state.depth / (int)pow(2, level);
	else if (target == GL_TEXTURE_1D_ARRAY || target == GL_TEXTURE_2D_ARRAY || target == GL_TEXTURE_CUBE_MAP_ARRAY)
		depth = state.depth;
	else
		depth = 1;
}